

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRST.cxx
# Opt level: O2

void __thiscall cmRST::ProcessLine(cmRST *this,string *line)

{
  RegularExpression *this_00;
  ulong uVar1;
  char *pcVar2;
  pointer pcVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  allocator<char> local_89;
  string file;
  string local_68;
  string local_48;
  
  bVar5 = this->LastLineEndedInColonColon;
  this->LastLineEndedInColonColon = false;
  bVar4 = std::operator==(line,"..");
  if ((bVar4) ||
     ((((uVar1 = line->_M_string_length, 2 < uVar1 &&
        (pcVar2 = (line->_M_dataplus)._M_p, *pcVar2 == '.')) && (pcVar2[1] == '.')) &&
      (iVar6 = isspace((int)pcVar2[2]), iVar6 != 0)))) {
    Reset(this);
    lVar7 = std::__cxx11::string::find_first_not_of((char *)line,0x43966c);
    this->Markup = (lVar7 == -1) + MarkupNormal;
    bVar5 = cmsys::RegularExpression::find(&this->CMakeDirective,line);
    if (bVar5) {
LAB_0018c95f:
      NormalLine(this,line);
      return;
    }
    bVar5 = cmsys::RegularExpression::find(&this->CMakeModuleDirective,line);
    if (bVar5) {
      cmsys::RegularExpressionMatch::match_abi_cxx11_
                (&file,&(this->CMakeModuleDirective).regmatch,1);
      if (file._M_string_length != 0) {
        std::__cxx11::string::string((string *)&local_48,(string *)&file);
        bVar5 = ProcessInclude(this,&local_48,IncludeModule);
        std::__cxx11::string::~string((string *)&local_48);
        if (bVar5) goto LAB_0018cb41;
      }
      NormalLine(this,line);
    }
    else {
      bVar5 = cmsys::RegularExpression::find(&this->ParsedLiteralDirective,line);
      if (bVar5) {
        this->Directive = DirectiveParsedLiteral;
        cmsys::RegularExpressionMatch::match_abi_cxx11_
                  (&file,&(this->ParsedLiteralDirective).regmatch,1);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &this->MarkupLines,&file);
      }
      else {
        bVar5 = cmsys::RegularExpression::find(&this->CodeBlockDirective,line);
        if (bVar5) {
          this->Directive = DirectiveCodeBlock;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::emplace_back<>(&this->MarkupLines);
          return;
        }
        this_00 = &this->ReplaceDirective;
        bVar5 = cmsys::RegularExpression::find(this_00,line);
        if (bVar5) {
          this->Directive = DirectiveReplace;
          cmsys::RegularExpressionMatch::match_abi_cxx11_(&file,&this_00->regmatch,1);
          std::__cxx11::string::operator=((string *)&this->ReplaceName,(string *)&file);
          std::__cxx11::string::~string((string *)&file);
          cmsys::RegularExpressionMatch::match_abi_cxx11_(&file,&this_00->regmatch,2);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &this->MarkupLines,&file);
        }
        else {
          bVar5 = cmsys::RegularExpression::find(&this->IncludeDirective,line);
          if (bVar5) {
            cmsys::RegularExpressionMatch::match_abi_cxx11_
                      (&file,&(this->IncludeDirective).regmatch,1);
            if (file._M_string_length != 0) {
              std::__cxx11::string::string((string *)&local_68,(string *)&file);
              bVar5 = ProcessInclude(this,&local_68,IncludeNormal);
              std::__cxx11::string::~string((string *)&local_68);
              if (bVar5) goto LAB_0018cb41;
            }
            NormalLine(this,line);
          }
          else {
            bVar5 = cmsys::RegularExpression::find(&this->TocTreeDirective,line);
            if (!bVar5) {
              bVar5 = cmsys::RegularExpression::find(&this->ProductionListDirective,line);
              if ((!bVar5) &&
                 (bVar5 = cmsys::RegularExpression::find(&this->NoteDirective,line), !bVar5)) {
                return;
              }
              goto LAB_0018c95f;
            }
            this->Directive = DirectiveTocTree;
            cmsys::RegularExpressionMatch::match_abi_cxx11_
                      (&file,&(this->TocTreeDirective).regmatch,1);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &this->MarkupLines,&file);
          }
        }
      }
    }
LAB_0018cb41:
    std::__cxx11::string::~string((string *)&file);
    return;
  }
  if (this->Markup == MarkupNone) {
    if ((uVar1 == 0) && (bVar5 != false)) {
      this->Markup = MarkupNormal;
      this->Directive = DirectiveLiteralBlock;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::emplace_back<>(&this->MarkupLines);
      std::__cxx11::string::string<std::allocator<char>>((string *)&file,"",&local_89);
      OutputLine(this,&file,false);
      goto LAB_0018cb41;
    }
LAB_0018cad6:
    NormalLine(this,line);
    uVar1 = line->_M_string_length;
    if ((uVar1 < 2) || (pcVar3 = (line->_M_dataplus)._M_p, pcVar3[uVar1 - 2] != ':')) {
      bVar5 = false;
    }
    else {
      bVar5 = pcVar3[uVar1 - 1] == ':';
    }
    this->LastLineEndedInColonColon = bVar5;
  }
  else {
    if (this->Markup == MarkupEmpty) {
      if (uVar1 == 0) goto LAB_0018c95f;
LAB_0018ca8e:
      iVar6 = isspace((int)*(line->_M_dataplus)._M_p);
      if (iVar6 == 0) goto LAB_0018cad6;
    }
    else if (uVar1 != 0) goto LAB_0018ca8e;
    this->Markup = MarkupNormal;
    if ((this->MarkupLines).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (this->MarkupLines).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->MarkupLines,line);
      return;
    }
  }
  return;
}

Assistant:

void cmRST::ProcessLine(std::string const& line)
{
  bool lastLineEndedInColonColon = this->LastLineEndedInColonColon;
  this->LastLineEndedInColonColon = false;

  // A line starting in .. is an explicit markup start.
  if (line == ".." ||
      (line.size() >= 3 && line[0] == '.' && line[1] == '.' &&
       isspace(line[2]))) {
    this->Reset();
    this->Markup =
      (line.find_first_not_of(" \t", 2) == std::string::npos ? MarkupEmpty
                                                             : MarkupNormal);
    if (this->CMakeDirective.find(line)) {
      // Output cmake domain directives and their content normally.
      this->NormalLine(line);
    } else if (this->CMakeModuleDirective.find(line)) {
      // Process cmake-module directive: scan .cmake file comments.
      std::string file = this->CMakeModuleDirective.match(1);
      if (file.empty() || !this->ProcessInclude(file, IncludeModule)) {
        this->NormalLine(line);
      }
    } else if (this->ParsedLiteralDirective.find(line)) {
      // Record the literal lines to output after whole block.
      this->Directive = DirectiveParsedLiteral;
      this->MarkupLines.push_back(this->ParsedLiteralDirective.match(1));
    } else if (this->CodeBlockDirective.find(line)) {
      // Record the literal lines to output after whole block.
      // Ignore the language spec and record the opening line as blank.
      this->Directive = DirectiveCodeBlock;
      this->MarkupLines.emplace_back();
    } else if (this->ReplaceDirective.find(line)) {
      // Record the replace directive content.
      this->Directive = DirectiveReplace;
      this->ReplaceName = this->ReplaceDirective.match(1);
      this->MarkupLines.push_back(this->ReplaceDirective.match(2));
    } else if (this->IncludeDirective.find(line)) {
      // Process the include directive or output the directive and its
      // content normally if it fails.
      std::string file = this->IncludeDirective.match(1);
      if (file.empty() || !this->ProcessInclude(file, IncludeNormal)) {
        this->NormalLine(line);
      }
    } else if (this->TocTreeDirective.find(line)) {
      // Record the toctree entries to process after whole block.
      this->Directive = DirectiveTocTree;
      this->MarkupLines.push_back(this->TocTreeDirective.match(1));
    } else if (this->ProductionListDirective.find(line)) {
      // Output productionlist directives and their content normally.
      this->NormalLine(line);
    } else if (this->NoteDirective.find(line)) {
      // Output note directives and their content normally.
      this->NormalLine(line);
    }
  }
  // An explicit markup start followed nothing but whitespace and a
  // blank line does not consume any indented text following.
  else if (this->Markup == MarkupEmpty && line.empty()) {
    this->NormalLine(line);
  }
  // Indented lines following an explicit markup start are explicit markup.
  else if (this->Markup && (line.empty() || isspace(line[0]))) {
    this->Markup = MarkupNormal;
    // Record markup lines if the start line was recorded.
    if (!this->MarkupLines.empty()) {
      this->MarkupLines.push_back(line);
    }
  }
  // A blank line following a paragraph ending in "::" starts a literal block.
  else if (lastLineEndedInColonColon && line.empty()) {
    // Record the literal lines to output after whole block.
    this->Markup = MarkupNormal;
    this->Directive = DirectiveLiteralBlock;
    this->MarkupLines.emplace_back();
    this->OutputLine("", false);
  }
  // Print non-markup lines.
  else {
    this->NormalLine(line);
    this->LastLineEndedInColonColon =
      (line.size() >= 2 && line[line.size() - 2] == ':' && line.back() == ':');
  }
}